

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmDec.c
# Opt level: O2

void Abc_NtkAreaOpt2(Sfm_Dec_t *p)

{
  uint uVar1;
  void *Entry;
  Vec_Ptr_t *p_00;
  void **ppvVar2;
  Abc_Obj_t *pAVar3;
  long *plVar4;
  Abc_Obj_t *Entry_00;
  int i;
  int iVar5;
  int iVar6;
  long lVar7;
  Abc_Ntk_t *pNtk;
  
  pNtk = p->pNtk;
  iVar6 = pNtk->vObjs->nSize;
  p_00 = (Vec_Ptr_t *)malloc(0x10);
  p_00->nCap = 1000;
  p_00->nSize = 0;
  ppvVar2 = (void **)malloc(8000);
  p_00->pArray = ppvVar2;
  iVar5 = iVar6;
  for (i = 0; i < iVar5; i = i + 1) {
    pAVar3 = Abc_NtkObj(pNtk,i);
    if ((pAVar3 != (Abc_Obj_t *)0x0) && ((pAVar3->field_0x14 & 0x20) != 0)) {
      __assert_fail("pObj->fMarkB == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/sfm/sfmDec.c"
                    ,0x799,"void Abc_NtkAreaOpt2(Sfm_Dec_t *)");
    }
    pNtk = p->pNtk;
    iVar5 = pNtk->vObjs->nSize;
  }
  for (iVar5 = 0; iVar5 < pNtk->vCos->nSize; iVar5 = iVar5 + 1) {
    plVar4 = (long *)Vec_PtrEntry(pNtk->vCos,iVar5);
    lVar7 = *(long *)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) + (long)*(int *)plVar4[4] * 8);
    uVar1 = *(uint *)(lVar7 + 0x14);
    if ((uVar1 & 0x2f) == 7) {
      *(uint *)(lVar7 + 0x14) = uVar1 | 0x20;
      Vec_PtrPush(p_00,*(void **)(*(long *)(*(long *)(*plVar4 + 0x20) + 8) +
                                 (long)*(int *)plVar4[4] * 8));
    }
    pNtk = p->pNtk;
  }
  iVar5 = 0;
  do {
    if (p_00->nSize <= iVar5) {
      for (iVar6 = 0; iVar6 < p->pNtk->vObjs->nSize; iVar6 = iVar6 + 1) {
        pAVar3 = Abc_NtkObj(p->pNtk,iVar6);
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          pAVar3->field_0x14 = pAVar3->field_0x14 & 0xdf;
        }
      }
      Vec_PtrFree(p_00);
      return;
    }
    pAVar3 = (Abc_Obj_t *)Vec_PtrEntry(p_00,iVar5);
    if ((pAVar3->field_0x14 & 0xf) != 0) {
      Entry_00 = Abc_NtkAreaOptOne(p,pAVar3->Id);
      if (Entry_00 == (Abc_Obj_t *)0x0) {
LAB_00448d63:
        for (lVar7 = 0; lVar7 < (pAVar3->vFanins).nSize; lVar7 = lVar7 + 1) {
          Entry = pAVar3->pNtk->vObjs->pArray[(pAVar3->vFanins).pArray[lVar7]];
          if ((*(uint *)((long)Entry + 0x14) & 0x2f) == 7) {
            *(uint *)((long)Entry + 0x14) = *(uint *)((long)Entry + 0x14) | 0x20;
            Vec_PtrPush(p_00,Entry);
          }
        }
      }
      else {
        uVar1 = *(uint *)&Entry_00->field_0x14;
        if ((((uVar1 & 0xf) == 7) && ((uVar1 & 0x20) == 0)) && ((Entry_00->vFanins).nSize != 0)) {
          pAVar3 = Entry_00;
          if (iVar6 <= Entry_00->Id) goto LAB_00448d63;
          *(uint *)&Entry_00->field_0x14 = uVar1 | 0x20;
          Vec_PtrPush(p_00,Entry_00);
        }
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

void Abc_NtkAreaOpt2( Sfm_Dec_t * p )
{
    Abc_Obj_t * pObj, * pObjNew, * pFanin; 
    int i, k, nStop = Abc_NtkObjNumMax(p->pNtk);
    Vec_Ptr_t * vFront = Vec_PtrAlloc( 1000 );
    Abc_NtkForEachObj( p->pNtk, pObj, i )
        assert( pObj->fMarkB == 0 );
    // start the queue of nodes to be tried
    Abc_NtkForEachCo( p->pNtk, pObj, i )
        if ( Abc_ObjIsNode(Abc_ObjFanin0(pObj)) && !Abc_ObjFanin0(pObj)->fMarkB )
        {
            Abc_ObjFanin0(pObj)->fMarkB = 1;
            Vec_PtrPush( vFront, Abc_ObjFanin0(pObj) );
        }
    // process nodes in this order
    Vec_PtrForEachEntry( Abc_Obj_t *, vFront, pObj, i )
    {
        if ( Abc_ObjIsNone(pObj) )
            continue;
        pObjNew = Abc_NtkAreaOptOne( p, Abc_ObjId(pObj) );
        if ( pObjNew != NULL )
        {
            if ( !Abc_ObjIsNode(pObjNew) || Abc_ObjFaninNum(pObjNew) == 0 || pObjNew->fMarkB )
                continue;
            if ( (int)Abc_ObjId(pObjNew) < nStop )
            {
                pObjNew->fMarkB = 1;
                Vec_PtrPush( vFront, pObjNew );
                continue;
            }
        }
        else
            pObjNew = pObj;
        Abc_ObjForEachFanin( pObjNew, pFanin, k )
            if ( Abc_ObjIsNode(pFanin) && Abc_ObjFaninNum(pObjNew) > 0 && !pFanin->fMarkB )
            {
                pFanin->fMarkB = 1;
                Vec_PtrPush( vFront, pFanin );
            }
    }
    Abc_NtkForEachObj( p->pNtk, pObj, i )
        pObj->fMarkB = 0;
    Vec_PtrFree( vFront );
}